

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O1

void __thiscall
capnp::InputStreamMessageReader::~InputStreamMessageReader(InputStreamMessageReader *this)

{
  ArrayPtr<const_capnp::word> *pAVar1;
  size_t sVar2;
  _func_int *p_Var3;
  word *pwVar4;
  ArrayDisposer *pAVar5;
  bool bVar6;
  
  (this->super_MessageReader)._vptr_MessageReader =
       (_func_int **)&PTR__InputStreamMessageReader_0021a938;
  if (this->readPos != (byte *)0x0) {
    bVar6 = kj::UnwindDetector::isUnwinding(&this->unwindDetector);
    pAVar1 = (this->moreSegments).ptr;
    sVar2 = (this->moreSegments).size_;
    p_Var3 = this->inputStream->_vptr_InputStream[3];
    if (bVar6) {
      (*p_Var3)();
    }
    else {
      (*p_Var3)(this->inputStream,
                (long)pAVar1[sVar2 - 1].ptr + (pAVar1[sVar2 - 1].size_ * 8 - (long)this->readPos));
    }
  }
  pwVar4 = (this->ownedSpace).ptr;
  if (pwVar4 != (word *)0x0) {
    sVar2 = (this->ownedSpace).size_;
    (this->ownedSpace).ptr = (word *)0x0;
    (this->ownedSpace).size_ = 0;
    pAVar5 = (this->ownedSpace).disposer;
    (*(code *)**(undefined8 **)pAVar5)(pAVar5,pwVar4,8,sVar2,sVar2,0);
  }
  pAVar1 = (this->moreSegments).ptr;
  if (pAVar1 != (ArrayPtr<const_capnp::word> *)0x0) {
    sVar2 = (this->moreSegments).size_;
    (this->moreSegments).ptr = (ArrayPtr<const_capnp::word> *)0x0;
    (this->moreSegments).size_ = 0;
    pAVar5 = (this->moreSegments).disposer;
    (*(code *)**(undefined8 **)pAVar5)(pAVar5,pAVar1,0x10,sVar2,sVar2,0);
  }
  SegmentArrayMessageReader::~SegmentArrayMessageReader((SegmentArrayMessageReader *)this);
  return;
}

Assistant:

InputStreamMessageReader::~InputStreamMessageReader() noexcept(false) {
  if (readPos != nullptr) {
    unwindDetector.catchExceptionsIfUnwinding([&]() {
      // Note that lazy reads only happen when we have multiple segments, so moreSegments.back() is
      // valid.
      const byte* allEnd = reinterpret_cast<const byte*>(moreSegments.back().end());
      inputStream.skip(allEnd - readPos);
    });
  }
}